

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

int prune_ref_frame(AV1_COMP *cpi,MACROBLOCK *x,MV_REFERENCE_FRAME ref_frame)

{
  int iVar1;
  MV_REFERENCE_FRAME rf [2];
  
  if (((uint)cpi->prune_ref_frame_mask >> ((byte)ref_frame & 0x1f) & 1) == 0) {
    iVar1 = prune_ref_by_selective_ref_frame
                      (cpi,x,rf,((cpi->common).cur_frame)->ref_display_order_hint);
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static inline int prune_ref_frame(const AV1_COMP *cpi, const MACROBLOCK *x,
                                  MV_REFERENCE_FRAME ref_frame) {
  const AV1_COMMON *const cm = &cpi->common;
  MV_REFERENCE_FRAME rf[2];
  av1_set_ref_frame(rf, ref_frame);

  if ((cpi->prune_ref_frame_mask >> ref_frame) & 1) return 1;

  if (prune_ref_by_selective_ref_frame(cpi, x, rf,
                                       cm->cur_frame->ref_display_order_hint)) {
    return 1;
  }

  return 0;
}